

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfFast.c
# Opt level: O1

void Cnf_ComputeClauses(Aig_Man_t *p,Aig_Obj_t *pRoot,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vNodes,
                       Vec_Int_t *vMap,Vec_Int_t *vCover,Vec_Int_t *vClauses)

{
  void *pvVar1;
  ulong uVar2;
  uint Entry;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  int *piVar6;
  uint uVar7;
  char *p_00;
  long lVar8;
  long lVar9;
  word Truth;
  word local_38;
  
  if ((pRoot->field_0x18 & 0x10) == 0) {
    __assert_fail("pRoot->fMarkA",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfFast.c"
                  ,0xcc,
                  "void Cnf_ComputeClauses(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  vClauses->nSize = 0;
  piVar6 = &pRoot->Id;
  if (vMap != (Vec_Int_t *)0x0) {
    iVar3 = *piVar6;
    if (((long)iVar3 < 0) || (vMap->nSize <= iVar3)) {
LAB_005523e1:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    piVar6 = vMap->pArray + iVar3;
  }
  iVar3 = *piVar6;
  if (iVar3 < 1) {
LAB_00552400:
    __assert_fail("iSatVar > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfFast.c"
                  ,0xb7,"int Cnf_ObjGetLit(Vec_Int_t *, Aig_Obj_t *, int)");
  }
  Cnf_CollectLeaves(pRoot,vLeaves,0);
  Cnf_CollectVolume(p,pRoot,vLeaves,vNodes);
  uVar7 = vNodes->nSize;
  if ((int)uVar7 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
  }
  if ((Aig_Obj_t *)vNodes->pArray[(ulong)uVar7 - 1] != pRoot) {
    __assert_fail("pRoot == Vec_PtrEntryLast(vNodes)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfFast.c"
                  ,0xd4,
                  "void Cnf_ComputeClauses(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  Entry = iVar3 * 2;
  uVar5 = 0;
  do {
    pvVar1 = vNodes->pArray[uVar5];
    p_00 = *(char **)((long)pvVar1 + 8);
    if (((((ulong)p_00 & 1) != 0) &&
        (p_00 = (char *)((ulong)p_00 & 0xfffffffffffffffe),
        ((ulong)((Aig_Man_t *)p_00)->vCos & 0x10) == 0)) ||
       ((uVar2 = *(ulong *)((long)pvVar1 + 0x10), (uVar2 & 1) != 0 &&
        ((*(byte *)((uVar2 & 0xfffffffffffffffe) + 0x18) & 0x10) == 0)))) goto LAB_0055209d;
    uVar5 = uVar5 + 1;
  } while (uVar7 != uVar5);
  uVar5 = (ulong)uVar7;
LAB_0055209d:
  if ((uint)uVar5 == uVar7) {
    Cnf_CollectLeaves(pRoot,vLeaves,1);
    Vec_IntPush(vClauses,0);
    Vec_IntPush(vClauses,Entry);
    if (0 < vLeaves->nSize) {
      lVar8 = 0;
      do {
        piVar6 = (int *)(((ulong)vLeaves->pArray[lVar8] & 0xfffffffffffffffe) + 0x24);
        if (vMap != (Vec_Int_t *)0x0) {
          iVar3 = *piVar6;
          if (((long)iVar3 < 0) || (vMap->nSize <= iVar3)) goto LAB_005523e1;
          piVar6 = vMap->pArray + iVar3;
        }
        if (*piVar6 < 1) goto LAB_00552400;
        Vec_IntPush(vClauses,((uint)vLeaves->pArray[lVar8] & 1) + *piVar6 * 2 ^ 1);
        lVar8 = lVar8 + 1;
      } while (lVar8 < vLeaves->nSize);
    }
    if (0 < vLeaves->nSize) {
      lVar8 = 0;
      do {
        pvVar1 = vLeaves->pArray[lVar8];
        Vec_IntPush(vClauses,0);
        Vec_IntPush(vClauses,Entry | 1);
        piVar6 = (int *)(((ulong)pvVar1 & 0xfffffffffffffffe) + 0x24);
        if (vMap != (Vec_Int_t *)0x0) {
          iVar3 = *piVar6;
          if (((long)iVar3 < 0) || (vMap->nSize <= iVar3)) goto LAB_005523e1;
          piVar6 = vMap->pArray + iVar3;
        }
        if (*piVar6 < 1) goto LAB_00552400;
        Vec_IntPush(vClauses,((uint)pvVar1 & 1) + *piVar6 * 2);
        lVar8 = lVar8 + 1;
      } while (lVar8 < vLeaves->nSize);
    }
  }
  else {
    if (6 < vLeaves->nSize) {
      p_00 = "FastCnfGeneration:  Internal error!!!";
      puts("FastCnfGeneration:  Internal error!!!");
    }
    if (6 < vLeaves->nSize) {
      __assert_fail("Vec_PtrSize(vLeaves) <= 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfFast.c"
                    ,0xf0,
                    "void Cnf_ComputeClauses(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    local_38 = Cnf_CutDeriveTruth((Aig_Man_t *)p_00,vLeaves,vNodes);
    if (local_38 + 1 < 2) {
      Vec_IntPush(vClauses,0);
      Vec_IntPush(vClauses,Entry | local_38 == 0);
      return;
    }
    iVar3 = Kit_TruthIsop((uint *)&local_38,vLeaves->nSize,vCover,0);
    if (iVar3 < 0) {
      __assert_fail("RetValue >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfFast.c"
                    ,0xfb,
                    "void Cnf_ComputeClauses(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    if (0 < vCover->nSize) {
      lVar8 = 0;
      do {
        uVar7 = vCover->pArray[lVar8];
        Vec_IntPush(vClauses,0);
        Vec_IntPush(vClauses,Entry);
        if (0 < vLeaves->nSize) {
          lVar9 = 0;
          do {
            uVar4 = uVar7 & 3;
            if (uVar4 != 0) {
              if (uVar4 == 3) {
                __assert_fail("(Cube & 3) != 3",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfFast.c"
                              ,0x105,
                              "void Cnf_ComputeClauses(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                             );
              }
              piVar6 = (int *)((long)vLeaves->pArray[lVar9] + 0x24);
              if (vMap != (Vec_Int_t *)0x0) {
                iVar3 = *piVar6;
                if (((long)iVar3 < 0) || (vMap->nSize <= iVar3)) goto LAB_005523e1;
                piVar6 = vMap->pArray + iVar3;
              }
              if (*piVar6 < 1) goto LAB_00552400;
              Vec_IntPush(vClauses,(uint)(uVar4 != 1) + *piVar6 * 2);
            }
            lVar9 = lVar9 + 1;
            uVar7 = (int)uVar7 >> 2;
          } while (lVar9 < vLeaves->nSize);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < vCover->nSize);
    }
    local_38 = ~local_38;
    iVar3 = Kit_TruthIsop((uint *)&local_38,vLeaves->nSize,vCover,0);
    if (iVar3 < 0) {
      __assert_fail("RetValue >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfFast.c"
                    ,0x10d,
                    "void Cnf_ComputeClauses(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    if (0 < vCover->nSize) {
      lVar8 = 0;
      do {
        uVar7 = vCover->pArray[lVar8];
        Vec_IntPush(vClauses,0);
        Vec_IntPush(vClauses,Entry | 1);
        if (0 < vLeaves->nSize) {
          lVar9 = 0;
          do {
            uVar4 = uVar7 & 3;
            if (uVar4 != 0) {
              if (uVar4 == 3) {
                __assert_fail("(Cube & 3) != 3",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfFast.c"
                              ,0x116,
                              "void Cnf_ComputeClauses(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                             );
              }
              piVar6 = (int *)((long)vLeaves->pArray[lVar9] + 0x24);
              if (vMap != (Vec_Int_t *)0x0) {
                iVar3 = *piVar6;
                if (((long)iVar3 < 0) || (vMap->nSize <= iVar3)) goto LAB_005523e1;
                piVar6 = vMap->pArray + iVar3;
              }
              if (*piVar6 < 1) goto LAB_00552400;
              Vec_IntPush(vClauses,(uint)(uVar4 != 1) + *piVar6 * 2);
            }
            lVar9 = lVar9 + 1;
            uVar7 = (int)uVar7 >> 2;
          } while (lVar9 < vLeaves->nSize);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < vCover->nSize);
    }
  }
  return;
}

Assistant:

void Cnf_ComputeClauses( Aig_Man_t * p, Aig_Obj_t * pRoot, 
    Vec_Ptr_t * vLeaves, Vec_Ptr_t * vNodes, Vec_Int_t * vMap, Vec_Int_t * vCover, Vec_Int_t * vClauses )
{
    Aig_Obj_t * pLeaf;
    int c, k, Cube, OutLit, RetValue;
    word Truth;
    assert( pRoot->fMarkA );

    Vec_IntClear( vClauses );

    OutLit = Cnf_ObjGetLit( vMap, pRoot, 0 );
    // detect cone
    Cnf_CollectLeaves( pRoot, vLeaves, 0 );
    Cnf_CollectVolume( p, pRoot, vLeaves, vNodes );
    assert( pRoot == Vec_PtrEntryLast(vNodes) );
    // check if this is an AND-gate
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pLeaf, k )
    {
        if ( Aig_ObjFaninC0(pLeaf) && !Aig_ObjFanin0(pLeaf)->fMarkA )
            break;
        if ( Aig_ObjFaninC1(pLeaf) && !Aig_ObjFanin1(pLeaf)->fMarkA )
            break;
    }
    if ( k == Vec_PtrSize(vNodes) )
    {
        Cnf_CollectLeaves( pRoot, vLeaves, 1 );
        // write big clause
        Vec_IntPush( vClauses, 0 );
        Vec_IntPush( vClauses, OutLit );
        Vec_PtrForEachEntry( Aig_Obj_t *, vLeaves, pLeaf, k )
            Vec_IntPush( vClauses, Cnf_ObjGetLit(vMap, Aig_Regular(pLeaf), !Aig_IsComplement(pLeaf)) );
        // write small clauses
        Vec_PtrForEachEntry( Aig_Obj_t *, vLeaves, pLeaf, k )
        {
            Vec_IntPush( vClauses, 0 );
            Vec_IntPush( vClauses, OutLit ^ 1 );
            Vec_IntPush( vClauses, Cnf_ObjGetLit(vMap, Aig_Regular(pLeaf), Aig_IsComplement(pLeaf)) );
        }
        return;
    }
    if ( Vec_PtrSize(vLeaves) > 6 )
        printf( "FastCnfGeneration:  Internal error!!!\n" );
    assert( Vec_PtrSize(vLeaves) <= 6 );

    Truth = Cnf_CutDeriveTruth( p, vLeaves, vNodes );
    if ( Truth == 0 || Truth == ~(word)0 )
    {
        Vec_IntPush( vClauses, 0 );
        Vec_IntPush( vClauses, (Truth == 0) ? (OutLit ^ 1) : OutLit );
        return;
    }

    RetValue = Kit_TruthIsop( (unsigned *)&Truth, Vec_PtrSize(vLeaves), vCover, 0 );
    assert( RetValue >= 0 );

    Vec_IntForEachEntry( vCover, Cube, c )
    {
        Vec_IntPush( vClauses, 0 );
        Vec_IntPush( vClauses, OutLit );
        for ( k = 0; k < Vec_PtrSize(vLeaves); k++, Cube >>= 2 )
        {
            if ( (Cube & 3) == 0 )
                continue;
            assert( (Cube & 3) != 3 );
            Vec_IntPush( vClauses, Cnf_ObjGetLit(vMap, (Aig_Obj_t *)Vec_PtrEntry(vLeaves,k), (Cube&3)!=1) );
        }
    }

    Truth = ~Truth;

    RetValue = Kit_TruthIsop( (unsigned *)&Truth, Vec_PtrSize(vLeaves), vCover, 0 );
    assert( RetValue >= 0 );
    Vec_IntForEachEntry( vCover, Cube, c )
    {
        Vec_IntPush( vClauses, 0 );
        Vec_IntPush( vClauses, OutLit ^ 1 );
        for ( k = 0; k < Vec_PtrSize(vLeaves); k++, Cube >>= 2 )
        {
            if ( (Cube & 3) == 0 )
                continue;
            assert( (Cube & 3) != 3 );
            Vec_IntPush( vClauses, Cnf_ObjGetLit(vMap, (Aig_Obj_t *)Vec_PtrEntry(vLeaves,k), (Cube&3)!=1) );
        }
    }
}